

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::SetParentAttribute
          (MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *att)

{
  if (((att != (PointAttribute *)0x0) &&
      ((att->super_GeometryAttribute).attribute_type_ == POSITION)) &&
     ((att->super_GeometryAttribute).num_components_ == '\x03')) {
    (this->predictor_).pos_attribute_ = att;
    return true;
  }
  return false;
}

Assistant:

bool SetParentAttribute(const PointAttribute *att) override {
    if (!att || att->attribute_type() != GeometryAttribute::POSITION) {
      return false;  // Invalid attribute type.
    }
    if (att->num_components() != 3) {
      return false;  // Currently works only for 3 component positions.
    }
    predictor_.SetPositionAttribute(*att);
    return true;
  }